

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

HttpRequest * parse_str_to_req(char *req_string)

{
  int iVar1;
  HttpRequest *__dest;
  char **__ptr;
  char **lines;
  undefined4 local_2d48;
  int status;
  undefined1 auStack_2c44 [260];
  undefined1 auStack_2b40 [32];
  undefined1 auStack_2b20 [10000];
  HttpRequest *local_410;
  HttpRequest *res;
  char req [1000];
  char *req_string_local;
  
  if (req_string == (char *)0x0) {
    req_string_local = (char *)0x0;
  }
  else {
    strcpy((char *)&res,req_string);
    __dest = (HttpRequest *)malloc(0x2938);
    local_2d48 = 0xffffffff;
    local_410 = __dest;
    memcpy(&status,"",0x100);
    memcpy(auStack_2c44,"",0x100);
    memset(auStack_2b40,0,0x20);
    memcpy(auStack_2b20,"",10000);
    memcpy(__dest,&local_2d48,0x2938);
    __ptr = _break_into_lines((char *)&res,local_410);
    if (__ptr == (char **)0x0) {
      free(local_410);
      req_string_local = (char *)0x0;
    }
    else {
      iVar1 = _parse_declaration(local_410,*__ptr);
      if ((iVar1 == -1) || (iVar1 = _parse_headers(local_410,__ptr + 1), iVar1 == -1)) {
        free(__ptr);
        free(local_410);
        req_string_local = (char *)0x0;
      }
      else {
        req_string_local = (char *)local_410;
      }
    }
  }
  return (HttpRequest *)req_string_local;
}

Assistant:

HttpRequest *parse_str_to_req(char *req_string) {
    if (req_string == NULL)
        return NULL;
    char req[MAX_REQUEST_LENGTH];
    strcpy(req, req_string);
    HttpRequest *res = malloc(sizeof(HttpRequest));
    *res = (HttpRequest) {.method = -1, .url = "\0", .host = "\0", .data = "\0"};
    int status;
    char **lines = _break_into_lines(req, res);
    if (lines == NULL) {
        free(res);
        return NULL;
    }
    status = _parse_declaration(res, lines[0]);
    if (status == -1) goto err_parse_out;

    status = _parse_headers(res, lines + 1);
    if (status == -1) goto err_parse_out;

    return res;

    err_parse_out:
    {
        free(lines);
        free(res);
        return NULL;
    }
}